

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaCommand.cpp
# Opt level: O0

int executeLoadManifestCommand
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args,bool loadOnly)

{
  FILE *pFVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  void *__s1;
  ulong uVar5;
  size_t __n;
  reference pbVar6;
  char *pcVar7;
  int *piVar8;
  undefined8 uVar9;
  __uniq_ptr_data<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>,_true,_true>
  _Var10;
  pointer pMVar11;
  error_code eVar12;
  StringRef local_2e8;
  StringRef local_2d8;
  unique_ptr<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_> local_2c8;
  unique_ptr<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_> manifest;
  undefined8 local_2b8;
  StringRef local_2b0;
  ManifestLoader local_2a0;
  ManifestLoader loader;
  LoadManifestActions actions;
  undefined1 local_270 [8];
  string workingDirectory;
  error_code ec;
  SmallString<128U> current_dir;
  sys local_190 [32];
  string local_170 [32];
  long local_150;
  size_t pos;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_140;
  string local_138 [8];
  string filename;
  undefined1 local_108 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> arg;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c0;
  const_iterator it;
  bool json;
  bool loadOnly_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  int local_c;
  
  it._M_current._6_1_ = 0;
  it._M_current._7_1_ = loadOnly;
  local_c0._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin(args);
  while( true ) {
    local_c8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(args);
    bVar2 = __gnu_cxx::operator!=(&local_c0,&local_c8);
    bVar3 = false;
    if (bVar2) {
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator*(&local_c0);
      __s1 = (void *)std::__cxx11::string::data();
      uVar5 = std::__cxx11::string::length();
      arg.field_2._8_8_ = (long)"operator--" + 9;
      __n = strlen("-");
      bVar3 = false;
      if (__n <= uVar5) {
        if (__n == 0) {
          local_c = 0;
        }
        else {
          local_c = memcmp(__s1,(void *)arg.field_2._8_8_,__n);
        }
        bVar3 = local_c == 0;
      }
    }
    if (!bVar3) break;
    pbVar6 = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_c0);
    std::__cxx11::string::string((string *)local_108,(string *)pbVar6);
    bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_108,"--json");
    pFVar1 = _stderr;
    if (bVar3) {
      it._M_current._6_1_ = 1;
    }
    else {
      pcVar7 = llbuild::commands::getProgramName();
      uVar9 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"error: %s: unknown option: \'%s\'\n",pcVar7,uVar9);
      args_local._4_4_ = 1;
    }
    std::__cxx11::string::~string((string *)local_108);
    if (!bVar3) {
      return args_local._4_4_;
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_c0);
  }
  filename.field_2._8_8_ =
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::end(args);
  bVar3 = __gnu_cxx::operator==
                    (&local_c0,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)((long)&filename.field_2 + 8));
  pFVar1 = _stderr;
  if (bVar3) {
    pcVar7 = llbuild::commands::getProgramName();
    fprintf(pFVar1,"error: %s: invalid number of arguments\n",pcVar7);
    return 1;
  }
  local_140 = __gnu_cxx::
              __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator++(&local_c0,0);
  pbVar6 = __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&local_140);
  std::__cxx11::string::string(local_138,(string *)pbVar6);
  pos = (size_t)std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::end(args);
  bVar3 = __gnu_cxx::operator!=
                    (&local_c0,
                     (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&pos);
  pFVar1 = _stderr;
  if (bVar3) {
    pcVar7 = llbuild::commands::getProgramName();
    fprintf(pFVar1,"error: %s: invalid number of arguments\n",pcVar7);
    args_local._4_4_ = 1;
  }
  else {
    local_150 = std::__cxx11::string::find_last_of((char)local_138,0x2f);
    if (local_150 != -1) {
      std::__cxx11::string::substr((ulong)local_170,(ulong)local_138);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      iVar4 = llbuild::basic::sys::chdir(pcVar7);
      std::__cxx11::string::~string(local_170);
      pFVar1 = _stderr;
      if ((((byte)iVar4 ^ 0xff) & 1) != 0) {
        pcVar7 = llbuild::commands::getProgramName();
        piVar8 = __errno_location();
        llbuild::basic::sys::strerror_abi_cxx11_(local_190,*piVar8);
        uVar9 = std::__cxx11::string::c_str();
        fprintf(pFVar1,"error: %s: unable to chdir(): %s\n",pcVar7,uVar9);
        std::__cxx11::string::~string((string *)local_190);
        args_local._4_4_ = 1;
        goto LAB_001302fe;
      }
      std::__cxx11::string::substr
                ((ulong)(current_dir.super_SmallVector<char,_128U>.
                         super_SmallVectorStorage<char,_128U>.InlineElts + 0x78),(ulong)local_138);
      std::__cxx11::string::operator=
                (local_138,
                 (string *)
                 (current_dir.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
                  InlineElts + 0x78));
      std::__cxx11::string::~string
                ((string *)
                 (current_dir.super_SmallVector<char,_128U>.super_SmallVectorStorage<char,_128U>.
                  InlineElts + 0x78));
    }
    llvm::SmallString<128U>::SmallString((SmallString<128U> *)&ec._M_cat);
    eVar12 = llvm::sys::fs::current_path((SmallVectorImpl<char> *)&ec._M_cat);
    ec._0_8_ = eVar12._M_cat;
    workingDirectory.field_2._8_4_ = eVar12._M_value;
    bVar3 = std::error_code::operator_cast_to_bool
                      ((error_code *)((long)&workingDirectory.field_2 + 8));
    pFVar1 = _stderr;
    if (bVar3) {
      pcVar7 = llbuild::commands::getProgramName();
      fprintf(pFVar1,"%s: error: cannot determine current directory\n",pcVar7);
      args_local._4_4_ = 1;
    }
    else {
      join_0x00000010_0x00000000_ = llvm::SmallString<128U>::str((SmallString<128U> *)&ec._M_cat);
      llvm::StringRef::operator_cast_to_string((string *)local_270,(StringRef *)&actions.NumErrors);
      anon_unknown.dwarf_5ec65::LoadManifestActions::LoadManifestActions
                ((LoadManifestActions *)&loader);
      uVar9 = std::__cxx11::string::data();
      local_2b0.Data = (char *)uVar9;
      uVar9 = std::__cxx11::string::length();
      local_2b0.Length = uVar9;
      _Var10.
      super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
      ._M_t.
      super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
      .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl =
           (__uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
            )std::__cxx11::string::data();
      manifest._M_t.
      super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
      ._M_t.
      super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
      .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl =
           (__uniq_ptr_data<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>,_true,_true>
            )(__uniq_ptr_data<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>,_true,_true>
              )_Var10.
               super___uniq_ptr_impl<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
               ._M_t.
               super__Tuple_impl<0UL,_llbuild::ninja::Manifest_*,_std::default_delete<llbuild::ninja::Manifest>_>
               .super__Head_base<0UL,_llbuild::ninja::Manifest_*,_false>._M_head_impl;
      uVar9 = std::__cxx11::string::length();
      local_2b8 = uVar9;
      llbuild::ninja::ManifestLoader::ManifestLoader
                (&local_2a0,local_2b0,_manifest,(ManifestLoaderActions *)&loader);
      llbuild::ninja::ManifestLoader::load((ManifestLoader *)&local_2c8);
      if ((it._M_current._7_1_ & 1) == 0) {
        if ((it._M_current._6_1_ & 1) == 0) {
          uVar9 = std::__cxx11::string::data();
          local_2e8.Data = (char *)uVar9;
          uVar9 = std::__cxx11::string::length();
          local_2e8.Length = uVar9;
          pMVar11 = std::
                    unique_ptr<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                    ::get(&local_2c8);
          dumpNinjaManifestText(local_2e8,pMVar11);
        }
        else {
          uVar9 = std::__cxx11::string::data();
          local_2d8.Data = (char *)uVar9;
          uVar9 = std::__cxx11::string::length();
          local_2d8.Length = uVar9;
          pMVar11 = std::
                    unique_ptr<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>
                    ::get(&local_2c8);
          dumpNinjaManifestJSON(local_2d8,pMVar11);
        }
      }
      args_local._4_4_ = 0;
      std::unique_ptr<llbuild::ninja::Manifest,_std::default_delete<llbuild::ninja::Manifest>_>::
      ~unique_ptr(&local_2c8);
      llbuild::ninja::ManifestLoader::~ManifestLoader(&local_2a0);
      anon_unknown.dwarf_5ec65::LoadManifestActions::~LoadManifestActions
                ((LoadManifestActions *)&loader);
      std::__cxx11::string::~string((string *)local_270);
    }
    llvm::SmallString<128U>::~SmallString((SmallString<128U> *)&ec._M_cat);
  }
LAB_001302fe:
  std::__cxx11::string::~string(local_138);
  return args_local._4_4_;
}

Assistant:

static int executeLoadManifestCommand(const std::vector<std::string>& args,
                                      bool loadOnly) {
  // Parse options.
  bool json = false;
  auto it = args.begin();
  for (; it != args.end() && StringRef(*it).startswith("-"); ++it) {
    auto arg = *it;

    if (arg == "--json") {
      json = true;
    } else {
      fprintf(stderr, "error: %s: unknown option: '%s'\n",
              getProgramName(), arg.c_str());
      return 1;
    }
  }
  if (it == args.end()) {
    fprintf(stderr, "error: %s: invalid number of arguments\n",
            getProgramName());
    return 1;
  }

  std::string filename = *it++;
  if (it != args.end()) {
    fprintf(stderr, "error: %s: invalid number of arguments\n",
            getProgramName());
    return 1;
  }

  // Change to the directory containing the input file, so include references
  // can be relative.
  //
  // FIXME: Need llvm::sys::fs.
  size_t pos = filename.find_last_of('/');
  if (pos != std::string::npos) {
    if (!sys::chdir(filename.substr(0, pos).c_str())) {
      fprintf(stderr, "error: %s: unable to chdir(): %s\n",
              getProgramName(), sys::strerror(errno).c_str());
      return 1;
    }
    filename = filename.substr(pos+1);
  }

  SmallString<128> current_dir;
  if (std::error_code ec = llvm::sys::fs::current_path(current_dir)) {
    fprintf(stderr, "%s: error: cannot determine current directory\n",
            getProgramName());
    return 1;
  }
  const std::string workingDirectory = current_dir.str();

  LoadManifestActions actions;
  ninja::ManifestLoader loader(workingDirectory, filename, actions);
  std::unique_ptr<ninja::Manifest> manifest = loader.load();

  // If only loading, we are done.
  if (loadOnly)
    return 0;

  if (json) {
    dumpNinjaManifestJSON(filename, manifest.get());
  } else {
    dumpNinjaManifestText(filename, manifest.get());
  }

  return 0;
}